

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::SerializeToZeroCopyStream
          (MessageLite *this,ZeroCopyOutputStream *output)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  MessageLite *in_R8;
  string_view action;
  LogMessage local_40;
  string local_30;
  
  iVar4 = (*this->_vptr_MessageLite[4])();
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar4) + 0x18);
  if (pcVar1 != (code *)0x0) {
    cVar2 = (*pcVar1)(this);
    if (cVar2 == '\0') {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                 ,0x217,"IsInitialized()");
      action._M_str = (char *)this;
      action._M_len = (size_t)"serialize";
      protobuf::(anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
                (&local_30,(_anonymous_namespace_ *)0x9,action,in_R8);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
  }
  bVar3 = SerializePartialToZeroCopyStream(this,output);
  return bVar3;
}

Assistant:

bool MessageLite::SerializeToZeroCopyStream(
    io::ZeroCopyOutputStream* output) const {
  ABSL_DCHECK(IsInitialized())
      << InitializationErrorMessage("serialize", *this);
  return SerializePartialToZeroCopyStream(output);
}